

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::base_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_base_type *type)

{
  t_base tVar1;
  int iVar2;
  char *pcVar3;
  undefined1 auVar4 [12];
  string local_40;
  
  tVar1 = type->base_;
  switch((t_base_type *)(ulong)tVar1) {
  case (t_base_type *)0x0:
    pcVar3 = "Void";
    break;
  case (t_base_type *)0x1:
    iVar2 = (*(type->super_t_type).super_t_doc._vptr_t_doc[7])(type);
    if ((char)iVar2 == '\0') {
      pcVar3 = "String";
    }
    else {
      pcVar3 = "Data";
      if (this->gen_cocoa_ != false) {
        pcVar3 = "TBinary";
      }
    }
    break;
  case (t_base_type *)0x2:
    pcVar3 = "Bool";
    break;
  case (t_base_type *)0x3:
    pcVar3 = "Int8";
    break;
  case (t_base_type *)0x4:
    pcVar3 = "Int16";
    break;
  case (t_base_type *)0x5:
    pcVar3 = "Int32";
    break;
  case (t_base_type *)0x6:
    pcVar3 = "Int64";
    break;
  case (t_base_type *)0x7:
    pcVar3 = "Double";
    break;
  default:
    auVar4 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_40,(t_base_type *)(ulong)tVar1,auVar4._8_4_);
    std::operator+(auVar4._0_8_,"compiler error: no Swift name for base type ",&local_40);
    __cxa_throw(auVar4._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,(allocator *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

t_swift_generator(t_program* program,
                    const map<string, string>& parsed_options,
                    const string& option_string)
    : t_oop_generator(program) {
    update_keywords();
	
    (void)option_string;
    map<string, string>::const_iterator iter;

    log_unexpected_ = false;
    async_clients_ = false;
    debug_descriptions_ = false;
    no_strict_ = false;
    namespaced_ = false;
    gen_cocoa_ = false;
    promise_kit_ = false;
    safe_enums_ = false;

    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("log_unexpected") == 0) {
        log_unexpected_ = true;
      } else if( iter->first.compare("async_clients") == 0) {
        async_clients_ = true;
      } else if( iter->first.compare("no_strict") == 0) {
        no_strict_ = true;
      } else if( iter->first.compare("debug_descriptions") == 0) {
        debug_descriptions_ = true;
      } else if( iter->first.compare("namespaced") == 0) {
        namespaced_ = true;
      } else if( iter->first.compare("cocoa") == 0) {
        gen_cocoa_ = true;
      } else if( iter->first.compare("safe_enums") == 0) {
        safe_enums_ = true;
      } else if( iter->first.compare("promise_kit") == 0) {
        if (gen_cocoa_ == false) {
          throw "PromiseKit only available with Swift 2.x, use `cocoa` option" + iter->first;
        }
        promise_kit_ = true;
      } else {
        throw "unknown option swift:" + iter->first;
      }
    }

    out_dir_base_ = "gen-swift";
  }